

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::sync_setup(NavierStokesBase *this,MultiFab **DeltaSsync)

{
  FabArray<amrex::FArrayBox> *this_00;
  MultiFab *this_01;
  long lVar1;
  int ncomp;
  MFInfo local_48;
  
  if (3 < (long)NUM_STATE) {
    ncomp = 0;
    lVar1 = 3;
    do {
      ncomp = ncomp + (uint)(advectionType.
                             super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
                             super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar1] == Conservative);
      lVar1 = lVar1 + 1;
    } while (NUM_STATE != lVar1);
    if ((ncomp != 0) &&
       ((this->super_AmrLevel).level <
        *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
                 field_0x8c)) {
      this_01 = (MultiFab *)operator_new(0x180);
      local_48.alloc = true;
      local_48._1_7_ = 0;
      local_48.arena = (Arena *)0x0;
      local_48.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      amrex::MultiFab::MultiFab
                (this_01,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,ncomp,0,
                 &local_48,
                 (this->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      *DeltaSsync = this_01;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      this_00 = &(*DeltaSsync)->super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (this_00,0.0,0,(this_00->super_FabArrayBase).n_comp,
                 &(this_00->super_FabArrayBase).n_grow);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::sync_setup (MultiFab*& DeltaSsync)
{
    AMREX_ASSERT(DeltaSsync == 0);

    int nconserved = 0;

    for (int comp = AMREX_SPACEDIM; comp < NUM_STATE; ++comp)
    {
        if (advectionType[comp] == Conservative)
            ++nconserved;
    }

    if (nconserved > 0 && level < parent->finestLevel())
    {
        DeltaSsync = new MultiFab(grids, dmap, nconserved, 0, MFInfo(), Factory());
        DeltaSsync->setVal(0);
    }
}